

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::detail::generic_type::mark_parents_nonsimple(generic_type *this,PyTypeObject *value)

{
  bool bVar1;
  PyObject **ppPVar2;
  type_info *ptVar3;
  type_info *tinfo2;
  handle h;
  iterator __end2;
  undefined1 local_48 [8];
  iterator __begin2;
  tuple *__range2;
  tuple local_20;
  tuple t;
  PyTypeObject *value_local;
  generic_type *this_local;
  
  t.super_object.super_handle.m_ptr = (object)(object)value;
  handle::handle((handle *)&__range2,value->tp_bases);
  reinterpret_borrow<pybind11::tuple>((pybind11 *)&local_20,(handle)__range2);
  __begin2._16_8_ = (pybind11 *)&local_20;
  object_api<pybind11::handle>::begin
            ((iterator *)local_48,(object_api<pybind11::handle> *)&local_20);
  object_api<pybind11::handle>::end((iterator *)&h,(object_api<pybind11::handle> *)__begin2._16_8_);
  while( true ) {
    bVar1 = iterator::operator!=((iterator *)local_48,(iterator *)&h);
    if (!bVar1) break;
    tinfo2 = (type_info *)iterator::operator*((iterator *)local_48);
    ppPVar2 = handle::ptr((handle *)&tinfo2);
    ptVar3 = get_type_info((PyTypeObject *)*ppPVar2);
    if (ptVar3 != (type_info *)0x0) {
      ptVar3->simple_type = false;
    }
    ppPVar2 = handle::ptr((handle *)&tinfo2);
    mark_parents_nonsimple(this,(PyTypeObject *)*ppPVar2);
    iterator::operator++((iterator *)local_48);
  }
  iterator::~iterator((iterator *)&h);
  iterator::~iterator((iterator *)local_48);
  tuple::~tuple(&local_20);
  return;
}

Assistant:

void mark_parents_nonsimple(PyTypeObject *value) {
        auto t = reinterpret_borrow<tuple>(value->tp_bases);
        for (handle h : t) {
            auto tinfo2 = get_type_info((PyTypeObject *) h.ptr());
            if (tinfo2)
                tinfo2->simple_type = false;
            mark_parents_nonsimple((PyTypeObject *) h.ptr());
        }
    }